

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaliperMetadataDB.cpp
# Opt level: O2

vector<cali::Attribute,_std::allocator<cali::Attribute>_> * __thiscall
cali::CaliperMetadataDB::CaliperMetadataDBImpl::get_attributes
          (vector<cali::Attribute,_std::allocator<cali::Attribute>_> *__return_storage_ptr__,
          CaliperMetadataDBImpl *this)

{
  _Base_ptr p_Var1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>
  it;
  Attribute local_60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>
  local_58;
  
  ::std::mutex::lock((mutex *)&this->m_attribute_lock);
  (__return_storage_ptr__->super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::reserve
            (__return_storage_ptr__,
             (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var1 = (this->m_attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_attributes)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)::std::_Rb_tree_increment(p_Var1)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>
    ::pair(&local_58,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>
            *)(p_Var1 + 1));
    local_60 = Attribute::make_attribute(local_58.second);
    std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::emplace_back<cali::Attribute>
              (__return_storage_ptr__,&local_60);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_attribute_lock);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Attribute> get_attributes() const
    {
        std::lock_guard<std::mutex> g(m_attribute_lock);

        std::vector<Attribute> ret;
        ret.reserve(m_attributes.size());

        for (auto it : m_attributes)
            ret.push_back(Attribute::make_attribute(it.second));

        return ret;
    }